

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

lua_Number lua_tonumberx(lua_State *L,int idx,int *pisnum)

{
  TValue *obj;
  int local_38;
  int isnum;
  TValue *o;
  lua_Number n;
  int *pisnum_local;
  lua_State *plStack_10;
  int idx_local;
  lua_State *L_local;
  
  n = (lua_Number)pisnum;
  pisnum_local._4_4_ = idx;
  plStack_10 = L;
  obj = index2addr(L,idx);
  if (obj->tt_ == 3) {
    o = (TValue *)(obj->value_).gc;
    local_38 = 1;
  }
  else {
    local_38 = luaV_tonumber_(obj,(lua_Number *)&o);
  }
  if (local_38 == 0) {
    o = (TValue *)0x0;
  }
  if (n != 0.0) {
    *(int *)n = local_38;
  }
  return (lua_Number)o;
}

Assistant:

LUA_API lua_Number lua_tonumberx(lua_State *L, int idx, int *pisnum) {
    lua_Number n;
    const TValue *o = index2addr(L, idx);
    int isnum = tonumber(o, &n);
    if (!isnum)
        n = 0;  /* call to 'tonumber' may change 'n' even if it fails */
    if (pisnum) *pisnum = isnum;
    return n;
}